

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O2

_Bool make_ranged_attack(monster_conflict *mon)

{
  short sVar1;
  wchar_t wVar2;
  loc grid1;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  uint32_t uVar7;
  wchar_t wVar8;
  monster_lore *lore;
  loc grid;
  long lVar9;
  int iVar10;
  int iVar11;
  wchar_t tdist;
  bitflag ai_pflags [3];
  bitflag f2 [12];
  bitflag f [12];
  bitflag ai_flags [5];
  char m_name [80];
  
  lore = get_lore(mon->race);
  if (player->timed[2] == 0) {
    _Var6 = monster_is_visible((monster *)mon);
  }
  else {
    _Var6 = false;
  }
  _Var4 = monster_can_cast(mon,false);
  if ((_Var4) || (_Var5 = monster_can_cast(mon,true), _Var5)) {
    flag_copy(f,mon->race->spell_flags,0xc);
    _Var5 = monster_is_smart((monster *)mon);
    if ((_Var5) && ((mon->hp < mon->maxhp / 10 && (uVar7 = Rand_div(2), uVar7 == 0)))) {
      ignore_spells(f,L'\x0f');
    }
    _Var5 = monster_is_stupid((monster *)mon);
    if (!_Var5) {
      monster_get_target_dist_grid(mon,&tdist,(loc *)0x0);
      flag_copy(f2,f,0xc);
      if (mon->maxhp <= mon->hp) {
        flag_off(f2,0xc,0x40);
      }
      _Var5 = flag_has_dbg(f2,0xc,0x41,"f2","RSF_HEAL_KIN");
      if ((_Var5) && (_Var5 = find_any_nearby_injured_kin((chunk *)cave,mon), !_Var5)) {
        flag_off(f2,0xc,0x41);
      }
      if (10 < mon->m_timed[5]) {
        flag_off(f2,0xc,0x3f);
      }
      if (tdist == L'\x01') {
        flag_off(f2,0xc,0x44);
        flag_off(f2,0xc,0x45);
      }
      if ((L'\x02' < tdist) && (flag_off(f2,0xc,2), L'\x03' < tdist)) {
        flag_off(f2,0xc,3);
      }
      if ((player->opts).opt[0x28] == true) {
        uVar7 = Rand_div(0x14);
        if (uVar7 == 0) {
          flag_wipe((mon->known_pstate).flags,5);
          flag_wipe((mon->known_pstate).pflags,3);
          for (lVar9 = 0; lVar9 != 0x19; lVar9 = lVar9 + 1) {
            (mon->known_pstate).el_info[lVar9].res_level = 0;
          }
        }
        flag_wipe(ai_flags,5);
        flag_wipe(ai_pflags,3);
        flag_copy(ai_flags,(mon->known_pstate).flags,5);
        flag_copy(ai_pflags,(mon->known_pstate).pflags,3);
        _Var5 = flag_is_empty(ai_flags,5);
        if ((_Var5) && (_Var5 = flag_is_empty(ai_pflags,3), _Var5)) {
          bVar3 = false;
        }
        else {
          bVar3 = true;
        }
        for (lVar9 = 0; lVar9 != 0x19; lVar9 = lVar9 + 1) {
          sVar1 = (mon->known_pstate).el_info[lVar9].res_level;
          *(short *)(m_name + lVar9 * 4) = sVar1;
          bVar3 = (bool)(bVar3 | sVar1 != 0);
        }
        if (bVar3) {
          unset_spells(f2,ai_flags,ai_pflags,(element_info *)m_name,mon);
        }
      }
      flag_copy(f,f2,0xc);
      monster_get_target_dist_grid(mon,(int *)0x0,(loc *)m_name);
      _Var5 = test_spells(f,L'\x01');
      if ((_Var5) && (_Var5 = projectable((chunk *)cave,mon->grid,(loc)m_name._0_8_,L'\b'), !_Var5))
      {
        ignore_spells(f,L'\x01');
      }
      if (player->upkeep->arena_level == false) {
        grid1 = mon->grid;
        for (iVar11 = grid1.y + L'\xfffffffe'; iVar10 = grid1.x + L'\xfffffffe',
            iVar11 <= grid1.y + L'\x02'; iVar11 = iVar11 + 1) {
          for (; iVar10 <= grid1.x + L'\x02'; iVar10 = iVar10 + 1) {
            grid = (loc)loc(iVar10,iVar11);
            _Var5 = square_in_bounds(cave,grid);
            if ((((_Var5) &&
                 (wVar8 = distance((loc_conflict)grid1,(loc_conflict)grid), wVar8 < L'\x03')) &&
                (_Var5 = square_iswarded(cave,grid), !_Var5)) &&
               ((_Var5 = square_isempty(cave,grid), _Var5 &&
                (_Var5 = los(cave,(loc_conflict)grid1,(loc_conflict)grid), _Var5))))
            goto LAB_00160449;
          }
        }
      }
      ignore_spells(f,L'Ѐ');
    }
LAB_00160449:
    _Var5 = flag_is_empty(f,0xc);
    if ((!_Var5) && (wVar8 = choose_attack_spell(f,!_Var4,_Var4), wVar8 != L'\0')) {
      monster_desc(m_name,0x50,(monster *)mon,L'̔');
      _Var4 = monster_is_camouflaged((monster *)mon);
      if (_Var4) {
        become_aware((chunk *)cave,mon);
      }
      wVar2 = mon->race->spell_power;
      if (wVar2 < L'\x02') {
        iVar11 = (wVar2 + L'\x03') / -4 + 0x19;
      }
      else {
        iVar11 = 0x18;
      }
      _Var4 = monster_is_stupid((monster *)mon);
      iVar10 = 0;
      if (!_Var4) {
        iVar10 = iVar11 + 0x14;
        if (mon->m_timed[3] == 0) {
          iVar10 = iVar11;
        }
        if ((mon->m_timed[2] != 0) || (mon->m_timed[7] != 0)) {
          iVar10 = iVar10 + 0x32;
        }
      }
      _Var4 = mon_spell_is_innate(wVar8);
      if ((_Var4) || (uVar7 = Rand_div(100), iVar10 <= (int)uVar7)) {
        disturb(player);
        do_mon_spell(wVar8,mon,_Var6);
        if (_Var6 != false) {
          flag_on_dbg(lore->spell_flags,0xc,wVar8,"lore->spell_flags","thrown_spell");
          _Var6 = mon_spell_is_innate(wVar8);
          if (_Var6) {
            if (lore->cast_innate != 0xff) {
              lore->cast_innate = lore->cast_innate + '\x01';
            }
          }
          else if (lore->cast_spell != 0xff) {
            lore->cast_spell = lore->cast_spell + '\x01';
          }
        }
        if ((player->is_dead == true) && (lore->deaths < 0x7fff)) {
          lore->deaths = lore->deaths + 1;
        }
        lore_update(mon->race,lore);
      }
      else {
        msg("%s tries to cast a spell, but fails.",m_name);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool make_ranged_attack(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int thrown_spell, failrate;
	bitflag f[RSF_SIZE];
	char m_name[80];
	bool seen = (player->timed[TMD_BLIND] == 0) && monster_is_visible(mon);
	bool innate = false;

	/* Check for cast this turn, non-innate and then innate */
	if (!monster_can_cast(mon, false)) {
		if (!monster_can_cast(mon, true)) {
			return false;
		} else {
			/* We're casting an innate "spell" */
			innate = true;
		}
	}

	/* Extract the racial spell flags */
	rsf_copy(f, mon->race->spell_flags);

	/* Smart monsters can use "desperate" spells */
	if (monster_is_smart(mon) && mon->hp < mon->maxhp / 10 && one_in_(2)) {
		ignore_spells(f, RST_DAMAGE);
	}

	/* Non-stupid monsters do some filtering */
	if (!monster_is_stupid(mon)) {
		struct loc tgrid;

		/* Remove the "ineffective" spells */
		remove_bad_spells(mon, f);

		/* Check for a clean bolt shot */
		monster_get_target_dist_grid(mon, NULL, &tgrid);
		if (test_spells(f, RST_BOLT) &&
			!projectable(cave, mon->grid, tgrid, PROJECT_STOP)) {
			ignore_spells(f, RST_BOLT);
		}

		/* Check for a possible summon */
		if (!summon_possible(mon->grid)) {
			ignore_spells(f, RST_SUMMON);
		}
	}

	/* No spells left */
	if (rsf_is_empty(f)) return false;

	/* Choose a spell to cast */
	thrown_spell = choose_attack_spell(f, innate, !innate);

	/* Abort if no spell was chosen */
	if (!thrown_spell) return false;

	/* There will be at least an attempt now, so get the monster's name */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* If we see a hidden monster try to cast a spell, become aware of it */
	if (monster_is_camouflaged(mon))
		become_aware(cave, mon);

	/* Check for spell failure (innate attacks never fail) */
	failrate = monster_spell_failrate(mon);
	if (!mon_spell_is_innate(thrown_spell) && (randint0(100) < failrate)) {
		msg("%s tries to cast a spell, but fails.", m_name);
		return true;
	}

	/* Cast the spell. */
	disturb(player);
	do_mon_spell(thrown_spell, mon, seen);

	/* Remember what the monster did */
	if (seen) {
		rsf_on(lore->spell_flags, thrown_spell);
		if (mon_spell_is_innate(thrown_spell)) {
			/* Innate spell */
			if (lore->cast_innate < UCHAR_MAX)
				lore->cast_innate++;
		} else {
			/* Bolt or Ball, or Special spell */
			if (lore->cast_spell < UCHAR_MAX)
				lore->cast_spell++;
		}
	}
	if (player->is_dead && (lore->deaths < SHRT_MAX)) {
		lore->deaths++;
	}
	lore_update(mon->race, lore);

	/* A spell was cast */
	return true;
}